

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::FindOrAllocateVertex(ON_SubD_FixedSizeHeap *this,ON_SubDFace *face0)

{
  bool bVar1;
  uint hash_00;
  uint uVar2;
  ON_SubDComponentPtr component0_00;
  uint local_7c;
  double local_68;
  double subdP [3];
  ON_SubDVertex *v1;
  uint hash;
  ON_SubDComponentPtr component0;
  uint face0_edge_count;
  ON_SubDFace *face0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if (face0 == (ON_SubDFace *)0x0) {
    local_7c = 0;
  }
  else {
    local_7c = (uint)face0->m_edge_count;
  }
  if (local_7c < 3) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    component0_00 = ON_SubDComponentPtr::Create(face0);
    hash_00 = Internal_Hash(this,component0_00);
    subdP[2] = (double)component0_00;
    this_local = (ON_SubD_FixedSizeHeap *)Internal_HashFindVertex1(this,hash_00,component0_00);
    if ((ON_SubDVertex *)this_local == (ON_SubDVertex *)0x0) {
      bVar1 = ON_SubDFace::GetSubdivisionPoint(face0,&local_68);
      if (bVar1) {
        this_local = (ON_SubD_FixedSizeHeap *)AllocateVertex(this,&local_68,local_7c);
        if ((ON_SubDVertex *)this_local == (ON_SubDVertex *)0x0) {
          ON_SubDIncrementErrorCount();
          this_local = (ON_SubD_FixedSizeHeap *)0x0;
        }
        else {
          uVar2 = ON_SubDComponentBase::SubdivisionLevel(&face0->super_ON_SubDComponentBase);
          ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,uVar2 + 1);
          ((ON_SubDVertex *)this_local)->m_vertex_tag = Smooth;
          Internal_HashAddPair(this,hash_00,component0_00,(ON_SubDVertex *)this_local);
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
    }
    else if (((ON_SubDVertex *)this_local)->m_edge_capacity < face0->m_edge_count) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_heap.cpp"
                 ,0x243,"","edge capacity was too small when vertex was created.");
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

ON_SubDVertex * ON_SubD_FixedSizeHeap::FindOrAllocateVertex(const ON_SubDFace * face0)
{
  const unsigned int face0_edge_count = (nullptr != face0) ? ((unsigned int)face0->m_edge_count) : 0U;
  if (face0_edge_count < 3)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const ON_SubDComponentPtr component0 = ON_SubDComponentPtr::Create(face0);
  const unsigned int hash = Internal_Hash(component0);
  ON_SubDVertex* v1 = Internal_HashFindVertex1(hash, component0);

  if (nullptr != v1)
  {
    // found the previously allocated vertex
    if (((unsigned int)v1->m_edge_capacity) < face0->m_edge_count)
    {
      ON_SUBD_ERROR("edge capacity was too small when vertex was created.");
    }
    return v1;
  }

  double subdP[3];
  if (false == face0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1 = AllocateVertex(subdP, face0_edge_count );
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( face0->SubdivisionLevel() + 1 );
  v1->m_vertex_tag = ON_SubDVertexTag::Smooth;

  Internal_HashAddPair(hash, component0, v1);

  return v1;
}